

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

iterator __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Push
          (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,iterator it,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  iterator iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)t);
  iVar1 = Push_impl(this,it,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return iVar1;
}

Assistant:

iterator Push(iterator it, T t) { return Push_impl(it, t); }